

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *s_00;
  long in_RSI;
  Slice local_58;
  Slice local_48;
  Status local_38 [3];
  undefined1 local_19;
  PosixWritableFile *this_local;
  Status *s;
  
  local_19 = 0;
  this_local = this;
  SyncDirIfManifest(this);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    iVar2 = fflush_unlocked(*(FILE **)(in_RSI + 0x28));
    if (iVar2 == 0) {
      iVar2 = fileno(*(FILE **)(in_RSI + 0x28));
      iVar2 = fdatasync(iVar2);
      if (iVar2 == 0) {
        return (Status)(char *)this;
      }
    }
    Slice::Slice(&local_48,(string *)(in_RSI + 8));
    piVar3 = __errno_location();
    s_00 = strerror(*piVar3);
    Slice::Slice(&local_58,s_00);
    Status::IOError(local_38,&local_48,&local_58);
    Status::operator=((Status *)this,local_38);
    Status::~Status(local_38);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Sync() {
                // Ensure new files referred to by the manifest are in the filesystem.
                Status s = SyncDirIfManifest();
                if (!s.ok()) {
                    return s;
                }
                if (fflush_unlocked(file_) != 0 ||
                    fdatasync(fileno(file_)) != 0) {
                    s = Status::IOError(filename_, strerror(errno));
                }
                return s;
            }